

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall ncnn::Split::Split(Split *this)

{
  Layer *in_RDI;
  
  Layer::Layer(in_RDI);
  in_RDI->_vptr_Layer = (_func_int **)&PTR__Split_001de9b8;
  in_RDI->one_blob_only = false;
  in_RDI->support_inplace = false;
  in_RDI->support_vulkan = true;
  in_RDI->support_packing = true;
  in_RDI->support_bf16_storage = true;
  return;
}

Assistant:

Split::Split()
{
    one_blob_only = false;
    support_inplace = false;
    support_vulkan = true;
    support_packing = true;
    support_bf16_storage = true;
}